

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void __thiscall GdlRenderer::DebugEngineCode(GdlRenderer *this,GrcManager *pcman,ostream *strmOut)

{
  uint32_t fxdRuleVersion;
  GdlRuleTable *pGVar1;
  ostream *poVar2;
  allocator local_a9;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  fxdRuleVersion = GrcManager::VersionForRules(pcman);
  std::__cxx11::string::string((string *)&local_48,"linebreak",&local_a9);
  pGVar1 = FindRuleTable(this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (pGVar1 != (GdlRuleTable *)0x0) {
    GdlRuleTable::DebugEngineCode(pGVar1,pcman,fxdRuleVersion,strmOut);
  }
  std::__cxx11::string::string((string *)&local_68,"substitution",&local_a9);
  pGVar1 = FindRuleTable(this,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (pGVar1 != (GdlRuleTable *)0x0) {
    GdlRuleTable::DebugEngineCode(pGVar1,pcman,fxdRuleVersion,strmOut);
  }
  if (-1 < this->m_ipassBidi) {
    poVar2 = std::operator<<(strmOut,"\nPASS ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ipassBidi + 1);
    std::operator<<(poVar2,": bidi\n");
  }
  std::__cxx11::string::string((string *)&local_88,"justification",&local_a9);
  pGVar1 = FindRuleTable(this,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  if (pGVar1 != (GdlRuleTable *)0x0) {
    GdlRuleTable::DebugEngineCode(pGVar1,pcman,fxdRuleVersion,strmOut);
  }
  std::__cxx11::string::string((string *)&local_a8,"positioning",&local_a9);
  pGVar1 = FindRuleTable(this,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  if (pGVar1 != (GdlRuleTable *)0x0) {
    GdlRuleTable::DebugEngineCode(pGVar1,pcman,fxdRuleVersion,strmOut);
  }
  return;
}

Assistant:

void GdlRenderer::DebugEngineCode(GrcManager * pcman, std::ostream & strmOut)
{
	GdlRuleTable * prultbl;

	uint32_t fxdRuleVersion = pcman->VersionForRules();

	if ((prultbl = FindRuleTable("linebreak")) != NULL)
		prultbl->DebugEngineCode(pcman, fxdRuleVersion, strmOut);

	if ((prultbl = FindRuleTable("substitution")) != NULL)
		prultbl->DebugEngineCode(pcman, fxdRuleVersion, strmOut);

	if (m_ipassBidi > -1)
		strmOut << "\nPASS " << m_ipassBidi + 1 << ": bidi\n";

	if ((prultbl = FindRuleTable("justification")) != NULL)
		prultbl->DebugEngineCode(pcman, fxdRuleVersion, strmOut);

	if ((prultbl = FindRuleTable("positioning")) != NULL)
		prultbl->DebugEngineCode(pcman, fxdRuleVersion, strmOut);
}